

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O0

UBool icu_63::LocaleUtility::isFallbackOf(UnicodeString *root,UnicodeString *child)

{
  char16_t cVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined1 local_1a;
  undefined1 local_19;
  UnicodeString *child_local;
  UnicodeString *root_local;
  
  iVar2 = UnicodeString::indexOf(child,root);
  local_19 = false;
  if (iVar2 == 0) {
    iVar2 = UnicodeString::length(child);
    iVar3 = UnicodeString::length(root);
    local_1a = true;
    if (iVar2 != iVar3) {
      iVar2 = UnicodeString::length(root);
      cVar1 = UnicodeString::charAt(child,iVar2);
      local_1a = cVar1 == L'_';
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

UBool
LocaleUtility::isFallbackOf(const UnicodeString& root, const UnicodeString& child)
{
    return child.indexOf(root) == 0 &&
      (child.length() == root.length() ||
       child.charAt(root.length()) == UNDERSCORE_CHAR);
}